

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall
ProblemTest_IncompleteNonlinearCon_Test::TestBody(ProblemTest_IncompleteNonlinearCon_Test *this)

{
  NumericConstant other;
  NumericExpr expr;
  bool bVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar2;
  ExprBase this_00;
  ExprBase EVar3;
  int iVar4;
  int iVar5;
  MutAlgebraicCon MVar6;
  AssertionResult gtest_ar;
  Problem p;
  undefined4 in_stack_fffffffffffffbb0;
  type_conflict in_stack_fffffffffffffbb4;
  undefined4 uVar7;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  int line;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  Type type;
  int iVar8;
  undefined4 in_stack_fffffffffffffc2c;
  AssertionResult local_3c0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3b0;
  int local_3a8;
  double in_stack_fffffffffffffc60;
  double in_stack_fffffffffffffc68;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffc70;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  pBVar2 = MVar6.
           super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  this_00.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                         (in_stack_fffffffffffffbb8,
                          (double)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  other.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffbc4;
  other.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffbc0;
  EVar3.impl_ = this_00.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffbb8,other,
             in_stack_fffffffffffffbb4);
  expr.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffbc4;
  expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffbc0;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            ((MutAlgebraicCon *)in_stack_fffffffffffffbb8,expr);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (pBVar2,in_stack_fffffffffffffc68,(double)EVar3.impl_);
  pBVar2 = MVar6.
           super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar4 = MVar6.
          super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3b0 = pBVar2;
  local_3a8 = iVar4;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x1209c8);
  type = (Type)((ulong)pBVar2 >> 0x20);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                     (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
  pBVar2 = MVar6.
           super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar5 = MVar6.
          super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  iVar8 = iVar5;
  EVar3.impl_ = (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
                        BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        ::nonlinear_expr((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                          *)in_stack_fffffffffffffbb8);
  testing::internal::EqHelper<false>::
  Compare<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((char *)pBVar2,(char *)CONCAT44(iVar5,in_stack_fffffffffffffbc0),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar3.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  line = (int)((ulong)pBVar2 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbb4);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00.impl_);
    testing::AssertionResult::failure_message((AssertionResult *)0x120ac6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00.impl_,type,(char *)CONCAT44(iVar4,in_stack_fffffffffffffbd0),
               line,(char *)CONCAT44(iVar5,in_stack_fffffffffffffbc0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)EVar3.impl_,(Message *)CONCAT44(in_stack_fffffffffffffc2c,iVar8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar7,in_stack_fffffffffffffbb0));
    testing::Message::~Message((Message *)0x120b12);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120b61);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)CONCAT44(uVar7,in_stack_fffffffffffffbb0)
            );
  return;
}

Assistant:

TEST(ProblemTest, IncompleteNonlinearCon) {
  Problem p;
  p.AddCon(0, 1).set_nonlinear_expr(p.MakeNumericConstant(42));
  p.AddCon(0, 1);
  EXPECT_EQ(mp::NumericExpr(), p.algebraic_con(1).nonlinear_expr());
}